

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int * getBiomeParaLimits(int mc,int id)

{
  int *piVar1;
  int (*paiVar2) [13];
  long lVar3;
  long lVar4;
  
  if (mc < 0x16) {
    return (int *)0x0;
  }
  if ((uint)mc < 0x1c) {
    if ((uint)mc < 0x19) {
LAB_0010f930:
      if (mc == 0x16) {
LAB_0010f935:
        lVar3 = 0;
        do {
          lVar4 = lVar3;
          if (lVar4 + 0x34 == 0xa5c) {
            return (int *)0x0;
          }
          lVar3 = lVar4 + 0x34;
        } while (*(int *)((long)g_biome_para_range_18[0] + lVar4) != id);
        return (int *)((long)g_biome_para_range_18[0] + lVar4 + 4);
      }
      paiVar2 = g_biome_para_range_19_diff;
      lVar3 = 0;
      do {
        lVar4 = lVar3 + 0x34;
        if (lVar4 == 0x16c) goto LAB_0010f935;
        piVar1 = (int *)((long)g_biome_para_range_19_diff[0] + lVar3);
        lVar3 = lVar4;
      } while (*piVar1 != id);
      goto LAB_0010f97c;
    }
  }
  else if (id == 0xba) {
    return g_biome_para_range_21wd_diff[0] + 1;
  }
  paiVar2 = g_biome_para_range_20_diff;
  lVar3 = 0;
  do {
    lVar4 = lVar3 + 0x34;
    if (lVar4 == 0x1a0) goto LAB_0010f930;
    piVar1 = (int *)((long)g_biome_para_range_20_diff[0] + lVar3);
    lVar3 = lVar4;
  } while (*piVar1 != id);
LAB_0010f97c:
  return (int *)((long)paiVar2[-1] + lVar4 + 4);
}

Assistant:

const int *getBiomeParaLimits(int mc, int id)
{
    if (mc <= MC_1_17)
        return NULL;
    int i;
    if (mc > MC_1_21_3)
    {
        for (i = 0; g_biome_para_range_21wd_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_21wd_diff[i][0] == id)
                return &g_biome_para_range_21wd_diff[i][1];
        }
    }
    if (mc > MC_1_19)
    {
        for (i = 0; g_biome_para_range_20_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_20_diff[i][0] == id)
                return &g_biome_para_range_20_diff[i][1];
        }
    }
    if (mc > MC_1_18)
    {
        for (i = 0; g_biome_para_range_19_diff[i][0] != -1; i++)
        {
            if (g_biome_para_range_19_diff[i][0] == id)
                return &g_biome_para_range_19_diff[i][1];
        }
    }
    for (i = 0; g_biome_para_range_18[i][0] != -1; i++)
    {
        if (g_biome_para_range_18[i][0] == id)
            return &g_biome_para_range_18[i][1];
    }
    return NULL;
}